

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OperationsExecuter.h
# Opt level: O0

bool __thiscall Refal2::COperationsExecuter::matchLeftBeginSaveToTable_V(COperationsExecuter *this)

{
  CUnitNode *nodeA;
  bool bVar1;
  CUnitNode **ppCVar2;
  CUnitNode *tmp;
  COperationsExecuter *this_local;
  
  bVar1 = shiftLeft(this);
  if (bVar1) {
    nodeA = this->left;
    bVar1 = CUnit::IsLeftParen(&this->left->super_CUnit);
    if (bVar1) {
      ppCVar2 = CUnit::PairedParen(&this->left->super_CUnit);
      this->left = *ppCVar2;
    }
    nextOperation(this);
    saveState(this);
    saveToTable(this,nodeA,this->left);
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

inline bool COperationsExecuter::matchLeftBeginSaveToTable_V()
{
	if( shiftLeft() ) {
		CUnitNode* tmp = left;
		if( left->IsLeftParen() ) {
			left = left->PairedParen();
		}
		nextOperation();
		saveState();
		saveToTable( tmp, left );
		return true;
	} else {
		return false;
	}
}